

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_NonLocalBCImpl.H
# Opt level: O2

Box * __thiscall
amrex::NonLocalBC::Rotate90CounterClockWise::operator()
          (Box *__return_storage_ptr__,Rotate90CounterClockWise *this,Box *box)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  
  iVar1 = (box->smallend).vect[2];
  uVar2 = (box->smallend).vect[1];
  iVar3 = (box->bigend).vect[2];
  iVar4 = (box->bigend).vect[0];
  *(ulong *)(__return_storage_ptr__->smallend).vect =
       CONCAT44((box->smallend).vect[0],~(box->bigend).vect[1]);
  (__return_storage_ptr__->smallend).vect[2] = iVar1;
  *(ulong *)(__return_storage_ptr__->bigend).vect = CONCAT44(iVar4,~uVar2);
  (__return_storage_ptr__->bigend).vect[2] = iVar3;
  (__return_storage_ptr__->btype).itype = 0;
  return __return_storage_ptr__;
}

Assistant:

Box operator() (Box const& box) const noexcept {
        return Box(operator()(IntVect{AMREX_D_DECL(box.smallEnd(0),
                                                   box.bigEnd  (1),
                                                   box.smallEnd(2))}),
                   operator()(IntVect{AMREX_D_DECL(box.bigEnd  (0),
                                                   box.smallEnd(1),
                                                   box.bigEnd  (2))}));
    }